

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::XmlUnitTestResultPrinter::PrintXmlUnitTest(FILE *out,UnitTest *unit_test)

{
  UnitTestImpl *this;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  pointer ppTVar4;
  TimeInMillis ms;
  long lVar5;
  string local_50;
  
  fwrite("<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27,1,(FILE *)out);
  uVar1 = UnitTest::total_test_count(unit_test);
  uVar2 = UnitTestImpl::failed_test_count(unit_test->impl_);
  this = unit_test->impl_;
  uVar3 = UnitTestImpl::disabled_test_count(this);
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_50,(internal *)this->elapsed_time_,ms);
  fprintf((FILE *)out,
          "<testsuites tests=\"%d\" failures=\"%d\" disabled=\"%d\" errors=\"0\" time=\"%s\" ",
          (ulong)uVar1,(ulong)uVar2,(ulong)uVar3,local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (FLAGS_gtest_shuffle == '\x01') {
    fprintf((FILE *)out,"random_seed=\"%d\" ",(ulong)(uint)unit_test->impl_->random_seed_);
  }
  fwrite("name=\"AllTests\">\n",0x11,1,(FILE *)out);
  ppTVar4 = (unit_test->impl_->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(unit_test->impl_->test_cases_).
                              super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4) >> 3)) {
    lVar5 = 0;
    do {
      PrintXmlTestCase(out,ppTVar4[lVar5]);
      lVar5 = lVar5 + 1;
      ppTVar4 = (unit_test->impl_->test_cases_).
                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar5 < (int)((ulong)((long)(unit_test->impl_->test_cases_).
                                         super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4)
                          >> 3));
  }
  fwrite("</testsuites>\n",0xe,1,(FILE *)out);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlUnitTest(FILE* out,
                                                const UnitTest& unit_test) {
  fprintf(out, "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  fprintf(out,
          "<testsuites tests=\"%d\" failures=\"%d\" disabled=\"%d\" "
          "errors=\"0\" time=\"%s\" ",
          unit_test.total_test_count(),
          unit_test.failed_test_count(),
          unit_test.disabled_test_count(),
          FormatTimeInMillisAsSeconds(unit_test.elapsed_time()).c_str());
  if (GTEST_FLAG(shuffle)) {
    fprintf(out, "random_seed=\"%d\" ", unit_test.random_seed());
  }
  fprintf(out, "name=\"AllTests\">\n");
  for (int i = 0; i < unit_test.total_test_case_count(); ++i)
    PrintXmlTestCase(out, *unit_test.GetTestCase(i));
  fprintf(out, "</testsuites>\n");
}